

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O1

void __thiscall
FIX::FieldBase::FieldBase
          (FieldBase *this,int tag,const_iterator valueStart,const_iterator valueEnd,
          const_iterator tagStart,const_iterator tagEnd)

{
  int iVar1;
  const_iterator cVar2;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_001ed588;
  this->m_tag = tag;
  (this->m_string)._M_dataplus._M_p = (pointer)&(this->m_string).field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&this->m_string,valueStart._M_current,valueEnd._M_current);
  (this->m_data)._M_dataplus._M_p = (pointer)&(this->m_data).field_2;
  (this->m_data)._M_string_length = 0;
  (this->m_data).field_2._M_local_buf[0] = '\0';
  iVar1 = 0;
  cVar2._M_current = tagStart._M_current;
  if (tagStart._M_current != tagEnd._M_current) {
    do {
      iVar1 = iVar1 + (uint)(byte)*cVar2._M_current;
      cVar2._M_current = cVar2._M_current + 1;
    } while (cVar2._M_current != tagEnd._M_current);
  }
  (this->m_metrics).m_length = (long)tagEnd._M_current - (long)tagStart._M_current;
  (this->m_metrics).m_checksum = iVar1;
  return;
}

Assistant:

FieldBase( int tag, 
             std::string::const_iterator valueStart, 
             std::string::const_iterator valueEnd,
             std::string::const_iterator tagStart, 
             std::string::const_iterator tagEnd )
    : m_tag( tag )
    , m_string( valueStart, valueEnd )
    , m_metrics( calculateMetrics( tagStart, tagEnd ) )
  {}